

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_9::DiskHandle::read(DiskHandle *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  long __offset;
  size_t total;
  Fault f;
  long local_58;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  local_58 = 0;
  do {
    if (__nbytes == 0) {
      return local_58;
    }
    do {
      sVar2 = pread64((this->fd).fd,__buf,__nbytes,__offset);
      if (-1 < sVar2) {
        iVar1 = 0;
        break;
      }
      iVar1 = _::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      local_50.exception = (Exception *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      _::Debug::Fault::init
                (&local_50,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::fatal(&local_50);
    }
    if (sVar2 == 0) {
      return local_58;
    }
    local_58 = local_58 + sVar2;
    __offset = __offset + sVar2;
    __buf = (void *)((long)__buf + sVar2);
    __nbytes = __nbytes - sVar2;
  } while( true );
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const {
    // pread() probably never returns short reads unless it hits EOF. Unfortunately, though, per
    // spec we are not allowed to assume this.

    size_t total = 0;
    while (buffer.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pread(fd, buffer.begin(), buffer.size(), offset));
      if (n == 0) break;
      total += n;
      offset += n;
      buffer = buffer.slice(n, buffer.size());
    }
    return total;
  }